

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPlayTree.h
# Opt level: O3

SPlayTree<int> * __thiscall BinTrees::SPlayTree<int>::i<int_const&>(SPlayTree<int> *this,int *v)

{
  int iVar1;
  int iVar2;
  BinTree<int> *pBVar3;
  BinTree<int> *pBVar4;
  runtime_error *this_00;
  BinTree<int> *pBVar5;
  BinTree<int> *pBVar6;
  BinTree<int> *pBVar7;
  BinTree<int> *pBVar8;
  long lVar9;
  
  iVar1 = *v;
  iVar2 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  pBVar3 = (BinTree<int> *)this;
  while (iVar2 != iVar1) {
    if (iVar2 < iVar1) {
      pBVar4 = pBVar3->r;
      if (pBVar4 == (BinTree<int> *)0x0) {
        lVar9 = 0x10;
LAB_001027d7:
        pBVar4 = (BinTree<int> *)operator_new(0x20);
        pBVar4->v = iVar1;
        pBVar4->l = (BinTree<int> *)0x0;
        pBVar4->r = (BinTree<int> *)0x0;
        pBVar4->p = pBVar3;
        *(BinTree<int> **)((long)&pBVar3->v + lVar9) = pBVar4;
        goto LAB_001027f2;
      }
    }
    else {
      pBVar4 = pBVar3->l;
      if (pBVar4 == (BinTree<int> *)0x0) {
        lVar9 = 8;
        goto LAB_001027d7;
      }
    }
    pBVar3 = pBVar4;
    iVar2 = pBVar4->v;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Repeated insert.");
LAB_00102b60:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_001027f2:
  while( true ) {
    pBVar3 = pBVar4->p;
    if (pBVar3 == (BinTree<int> *)0x0) {
      return (SPlayTree<int> *)(BinTree<int> *)this;
    }
    pBVar7 = pBVar3->p;
    if (pBVar7 != (BinTree<int> *)0x0) break;
    pBVar7 = pBVar3->l;
    if (pBVar4 == pBVar7) {
      pBVar8 = pBVar7->r;
      pBVar3->l = pBVar8;
      pBVar5 = pBVar7;
      if (pBVar8 == (BinTree<int> *)0x0) {
        pBVar7->p = (BinTree<int> *)0x0;
      }
      else {
        pBVar8->p = pBVar3;
        pBVar8 = pBVar3->p;
        pBVar7->p = pBVar8;
        if (pBVar8 != (BinTree<int> *)0x0) {
          (&pBVar8->l)[pBVar8->r == pBVar3] = pBVar7;
          pBVar5 = (BinTree<int> *)this;
        }
      }
      pBVar7->r = pBVar3;
      this = (SPlayTree<int> *)pBVar5;
    }
    else {
      pBVar7 = pBVar3->r;
      pBVar8 = pBVar7->l;
      pBVar3->r = pBVar8;
      pBVar5 = pBVar7;
      if (pBVar8 == (BinTree<int> *)0x0) {
        pBVar7->p = (BinTree<int> *)0x0;
      }
      else {
        pBVar8->p = pBVar3;
        pBVar8 = pBVar3->p;
        pBVar7->p = pBVar8;
        if (pBVar8 != (BinTree<int> *)0x0) {
          (&pBVar8->l)[pBVar8->l != pBVar3] = pBVar7;
          pBVar5 = (BinTree<int> *)this;
        }
      }
      pBVar7->l = pBVar3;
      this = (SPlayTree<int> *)pBVar5;
    }
    pBVar3->p = pBVar7;
  }
  pBVar8 = pBVar7->l;
  if ((pBVar8 == (BinTree<int> *)0x0) || (pBVar4 != pBVar8->l)) {
    pBVar5 = pBVar7->r;
    if ((pBVar5 == (BinTree<int> *)0x0) || (pBVar4 != pBVar5->r)) {
      if ((pBVar8 == (BinTree<int> *)0x0) || (pBVar4 != pBVar8->r)) {
        if ((pBVar5 == (BinTree<int> *)0x0) || (pBVar4 != pBVar5->l)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"whoops!");
          goto LAB_00102b60;
        }
        pBVar8 = pBVar3->l;
        pBVar5 = pBVar8->r;
        pBVar3->l = pBVar5;
        if (pBVar5 == (BinTree<int> *)0x0) {
          pBVar8->p = pBVar7;
LAB_00102a19:
          (&pBVar7->l)[pBVar7->r == pBVar3] = pBVar8;
          pBVar5 = (BinTree<int> *)this;
        }
        else {
          pBVar5->p = pBVar3;
          pBVar7 = pBVar3->p;
          pBVar8->p = pBVar7;
          pBVar5 = pBVar8;
          if (pBVar7 != (BinTree<int> *)0x0) goto LAB_00102a19;
        }
        pBVar8->r = pBVar3;
        pBVar3->p = pBVar8;
        pBVar3 = pBVar4->p;
        pBVar7 = pBVar3->r;
        pBVar8 = pBVar7->l;
        pBVar3->r = pBVar8;
        if (pBVar8 != (BinTree<int> *)0x0) {
          pBVar8->p = pBVar3;
        }
        pBVar8 = pBVar3->p;
        pBVar7->p = pBVar8;
        this = (SPlayTree<int> *)pBVar7;
        if (pBVar8 != (BinTree<int> *)0x0) {
          (&pBVar8->l)[pBVar8->l != pBVar3] = pBVar7;
          this = (SPlayTree<int> *)pBVar5;
        }
        pBVar7->l = pBVar3;
        pBVar3->p = pBVar7;
      }
      else {
        pBVar8 = pBVar3->r;
        pBVar5 = pBVar8->l;
        pBVar3->r = pBVar5;
        if (pBVar5 == (BinTree<int> *)0x0) {
          pBVar8->p = pBVar7;
LAB_00102ad3:
          (&pBVar7->l)[pBVar7->l != pBVar3] = pBVar8;
          pBVar5 = (BinTree<int> *)this;
        }
        else {
          pBVar5->p = pBVar3;
          pBVar7 = pBVar3->p;
          pBVar8->p = pBVar7;
          pBVar5 = pBVar8;
          if (pBVar7 != (BinTree<int> *)0x0) goto LAB_00102ad3;
        }
        pBVar8->l = pBVar3;
        pBVar3->p = pBVar8;
        pBVar3 = pBVar4->p;
        pBVar7 = pBVar3->l;
        pBVar8 = pBVar7->r;
        pBVar3->l = pBVar8;
        if (pBVar8 != (BinTree<int> *)0x0) {
          pBVar8->p = pBVar3;
        }
        pBVar8 = pBVar3->p;
        pBVar7->p = pBVar8;
        this = (SPlayTree<int> *)pBVar7;
        if (pBVar8 != (BinTree<int> *)0x0) {
          (&pBVar8->l)[pBVar8->r == pBVar3] = pBVar7;
          this = (SPlayTree<int> *)pBVar5;
        }
        pBVar7->r = pBVar3;
        pBVar3->p = pBVar7;
      }
      goto LAB_001027f2;
    }
    pBVar3 = pBVar5->l;
    pBVar7->r = pBVar3;
    if (pBVar3 != (BinTree<int> *)0x0) {
      pBVar3->p = pBVar7;
    }
    pBVar3 = pBVar7->p;
    pBVar5->p = pBVar3;
    pBVar6 = pBVar5;
    if (pBVar3 != (BinTree<int> *)0x0) {
      (&pBVar3->l)[pBVar3->l != pBVar7] = pBVar5;
      pBVar6 = (BinTree<int> *)this;
    }
    pBVar5->l = pBVar7;
    pBVar7->p = pBVar5;
    pBVar7 = pBVar4->p;
    pBVar8 = pBVar7->r;
    pBVar3 = pBVar8->l;
    pBVar7->r = pBVar3;
    if (pBVar3 != (BinTree<int> *)0x0) {
      pBVar3->p = pBVar7;
    }
    pBVar3 = pBVar7->p;
    pBVar8->p = pBVar3;
    this = (SPlayTree<int> *)pBVar8;
    if (pBVar3 != (BinTree<int> *)0x0) {
      (&pBVar3->l)[pBVar3->l != pBVar7] = pBVar8;
      this = (SPlayTree<int> *)pBVar6;
    }
    pBVar8->l = pBVar7;
  }
  else {
    pBVar3 = pBVar8->r;
    pBVar7->l = pBVar3;
    if (pBVar3 != (BinTree<int> *)0x0) {
      pBVar3->p = pBVar7;
    }
    pBVar3 = pBVar7->p;
    pBVar8->p = pBVar3;
    pBVar5 = pBVar8;
    if (pBVar3 != (BinTree<int> *)0x0) {
      (&pBVar3->l)[pBVar3->r == pBVar7] = pBVar8;
      pBVar5 = (BinTree<int> *)this;
    }
    pBVar8->r = pBVar7;
    pBVar7->p = pBVar8;
    pBVar7 = pBVar4->p;
    pBVar8 = pBVar7->l;
    pBVar3 = pBVar8->r;
    pBVar7->l = pBVar3;
    if (pBVar3 != (BinTree<int> *)0x0) {
      pBVar3->p = pBVar7;
    }
    pBVar3 = pBVar7->p;
    pBVar8->p = pBVar3;
    this = (SPlayTree<int> *)pBVar8;
    if (pBVar3 != (BinTree<int> *)0x0) {
      (&pBVar3->l)[pBVar3->r == pBVar7] = pBVar8;
      this = (SPlayTree<int> *)pBVar5;
    }
    pBVar8->r = pBVar7;
  }
  pBVar7->p = pBVar8;
  goto LAB_001027f2;
}

Assistant:

SPlayTree<T> *SPlayTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new SPlayTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<SPlayTree<T> *>(ip);
        while (i->P()) {
            if (i->P()->P() == nullptr) {
                if (i == i->p()->l())
                    root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                else
                    root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else throw std::runtime_error("whoops!");
        }

        return root;
    }